

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoZ.cpp
# Opt level: O0

void __thiscall OpenMD::RhoZ::writeDensity(RhoZ *this)

{
  bool bVar1;
  byte bVar2;
  reference pdVar3;
  size_type sVar4;
  char *pcVar5;
  ostream *poVar6;
  reference pvVar7;
  undefined8 uVar8;
  long in_RDI;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  RealType z;
  uint i;
  ofstream rdfStream;
  RealType zAve;
  RealType zSum;
  iterator j;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd28;
  errorStruct *peVar12;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffd30;
  uint local_240;
  long local_230 [64];
  double local_30;
  double *local_28;
  double *local_20;
  double local_18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_10 [2];
  
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(local_10);
  local_18 = 0.0;
  local_20 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffd28);
  local_10[0]._M_current = local_20;
  while( true ) {
    local_28 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffd28);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffd30,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffd28);
    local_30 = local_18;
    if (!bVar1) break;
    pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(local_10);
    local_18 = *pdVar3 + local_18;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(local_10);
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x730));
  auVar10._8_4_ = (int)(sVar4 >> 0x20);
  auVar10._0_8_ = sVar4;
  auVar10._12_4_ = 0x45300000;
  local_30 = local_30 /
             ((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_230,pcVar5,_S_out);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    uVar8 = std::__cxx11::string::c_str();
    peVar12 = &painCave;
    snprintf(painCave.errMsg,2000,"RhoZ: unable to open %s\n",uVar8);
    peVar12->isFatal = 1;
    simError();
  }
  else {
    poVar6 = std::operator<<((ostream *)local_230,"#Rho(");
    poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0x768));
    std::operator<<(poVar6,")\n");
    poVar6 = std::operator<<((ostream *)local_230,"#nFrames:\t");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)(in_RDI + 0xd0));
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<((ostream *)local_230,"#selection: (");
    poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0xd8));
    std::operator<<(poVar6,")\n");
    poVar6 = std::operator<<((ostream *)local_230,"#");
    poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0x768));
    std::operator<<(poVar6,"\tdensity (g cm^-3)\t");
    std::ostream::operator<<(local_230,std::endl<char,std::char_traits<char>>);
    std::ios_base::precision((ios_base *)((long)local_230 + *(long *)(local_230[0] + -0x18)),8);
    for (local_240 = 0;
        sVar4 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x748)),
        local_240 < sVar4; local_240 = local_240 + 1) {
      dVar9 = local_30 * ((double)local_240 + 0.5);
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x748));
      auVar11._8_4_ = (int)(sVar4 >> 0x20);
      auVar11._0_8_ = sVar4;
      auVar11._12_4_ = 0x45300000;
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (local_230,
                          dVar9 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)));
      poVar6 = std::operator<<(poVar6,"\t");
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x748),
                          (ulong)local_240);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(*pvVar7 * 1.66053886) / (double)*(int *)(in_RDI + 0xd0));
      std::operator<<(poVar6,"\t");
      std::ostream::operator<<(local_230,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_230);
  return;
}

Assistant:

void RhoZ::writeDensity() {
    // compute average box length:
    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }
    RealType zAve = zSum / zBox_.size();

    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#Rho(" << axisLabel_ << ")\n";
      rdfStream << "#nFrames:\t" << nProcessed_ << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#" << axisLabel_ << "\tdensity (g cm^-3)\t";

      rdfStream << std::endl;

      rdfStream.precision(8);  // same precision as the RNEMD files

      for (unsigned int i = 0; i < density_.size(); ++i) {
        RealType z = zAve * (i + 0.5) / density_.size();
        rdfStream << z << "\t"
                  << Constants::densityConvert * density_[i] / nProcessed_
                  << "\t";

        rdfStream << std::endl;
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RhoZ: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }